

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::deinit(Texture2DFilteringCase *this)

{
  pointer pFVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  
  ppTVar2 = (this->m_textures).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->m_textures).
                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar3 != ppTVar2; ppTVar3 = ppTVar3 + 1) {
    if (*ppTVar3 != (Texture2D *)0x0) {
      (*(*ppTVar3)->_vptr_Texture2D[1])();
    }
    ppTVar2 = (this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppTVar3 = (this->m_textures).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar2 != ppTVar3) {
    (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar3;
  }
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  pFVar1 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_cases).
      super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    (this->m_cases).
    super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  return;
}

Assistant:

void Texture2DFilteringCase::deinit (void)
{
	for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	m_renderer.clear();
	m_cases.clear();
}